

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O2

Int64Vector * __thiscall CoreML::Specification::Int64Vector::New(Int64Vector *this,Arena *arena)

{
  Int64Vector *this_00;
  
  this_00 = (Int64Vector *)operator_new(0x28);
  Int64Vector(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::Int64Vector>(arena,this_00);
  }
  return this_00;
}

Assistant:

Int64Vector* Int64Vector::New(::google::protobuf::Arena* arena) const {
  Int64Vector* n = new Int64Vector;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}